

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argagg.hpp
# Opt level: O3

parser_results * __thiscall
argagg::parser::parse(parser_results *__return_storage_ptr__,parser *this,int argc,char **argv)

{
  pointer *pppcVar1;
  pointer *ppoVar2;
  char cVar3;
  pointer pdVar4;
  iterator __position;
  definition *__k;
  iterator iVar5;
  char cVar6;
  int iVar7;
  size_t sVar8;
  size_t sVar9;
  char *pcVar10;
  const_iterator cVar11;
  char *pcVar12;
  mapped_type *pmVar13;
  domain_error *this_00;
  ostream *poVar14;
  runtime_error *prVar15;
  pointer poVar16;
  key_type *__k_00;
  bool bVar17;
  pointer __x;
  char **ppcVar18;
  uint uVar19;
  char *pcVar20;
  char *arg_i_cstr;
  string long_flag_str;
  option_result opt_result;
  parser_map map;
  char *local_a98;
  parser_results *local_a90;
  key_type local_a88;
  char *local_a68;
  char *local_a60;
  char **local_a58;
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,argagg::option_results>,std::allocator<std::pair<std::__cxx11::string_const,argagg::option_results>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *local_a50;
  size_t local_a48;
  vector<char_const*,std::allocator<char_const*>> *local_a40;
  string local_a38 [32];
  undefined1 local_a18 [376];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_8a0;
  parser_map local_868;
  
  local_a58 = (char **)CONCAT44(local_a58._4_4_,argc);
  validate_definitions(&local_868,&this->definitions);
  local_8a0._M_buckets = &local_8a0._M_single_bucket;
  local_8a0._M_bucket_count = 1;
  local_8a0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_8a0._M_element_count = 0;
  local_8a0._M_rehash_policy._M_max_load_factor = 1.0;
  local_8a0._M_rehash_policy._4_4_ = 0;
  local_8a0._M_rehash_policy._M_next_resize = 0;
  local_8a0._M_single_bucket = (__node_base_ptr)0x0;
  __return_storage_ptr__->program = *argv;
  local_a50 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,argagg::option_results>,std::allocator<std::pair<std::__cxx11::string_const,argagg::option_results>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
               *)&__return_storage_ptr__->options;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)local_a50,&local_8a0);
  (__return_storage_ptr__->pos).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->pos).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->pos).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __x = (this->definitions).
        super__Vector_base<argagg::definition,_std::allocator<argagg::definition>_>._M_impl.
        super__Vector_impl_data._M_start;
  pdVar4 = (this->definitions).
           super__Vector_base<argagg::definition,_std::allocator<argagg::definition>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_a90 = __return_storage_ptr__;
  if (__x != pdVar4) {
    do {
      local_a88._M_dataplus._M_p = (pointer)0x0;
      local_a88._M_string_length = 0;
      local_a88.field_2._M_allocated_capacity = 0;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>
      ::pair<argagg::option_results_&,_true>
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>
                  *)local_a18,&__x->name,(option_results *)&local_a88);
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,argagg::option_results>,std::allocator<std::pair<std::__cxx11::string_const,argagg::option_results>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::pair<std::__cxx11::string,argagg::option_results>>
                (local_a50,
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>
                  *)local_a18);
      if ((pointer)local_a18._32_8_ != (pointer)0x0) {
        operator_delete((void *)local_a18._32_8_);
      }
      if ((undefined1 *)local_a18._0_8_ != local_a18 + 0x10) {
        operator_delete((void *)local_a18._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a88._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_a88._M_dataplus._M_p);
      }
      __x = __x + 1;
    } while (__x != pdVar4);
  }
  if ((int)local_a58 != 1) {
    local_a40 = (vector<char_const*,std::allocator<char_const*>> *)&local_a90->pos;
    local_a58 = argv + (int)local_a58;
    ppcVar18 = argv + 1;
    bVar17 = false;
    local_a68 = (char *)0x0;
    poVar16 = (pointer)0x0;
    uVar19 = 0;
    do {
      pcVar12 = *ppcVar18;
      local_a98 = pcVar12;
      sVar8 = strlen(pcVar12);
      if ((bVar17) || (uVar19 != 0)) {
        if (uVar19 == 0) goto LAB_0010b7ea;
        poVar16->arg = pcVar12;
        uVar19 = uVar19 - 1;
      }
      else if (sVar8 < 2) {
LAB_0010b7ea:
        if ((*pcVar12 == '-') && (pcVar12[1] == '-' && sVar8 == 2)) {
          bVar17 = true;
        }
        else {
LAB_0010b80a:
          __position._M_current =
               (local_a90->pos).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (local_a90->pos).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<char_const*,std::allocator<char_const*>>::
            _M_realloc_insert<char_const*const&>(local_a40,__position,&local_a98);
          }
          else {
            *__position._M_current = pcVar12;
            pppcVar1 = &(local_a90->pos).
                        super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                        super__Vector_impl_data._M_finish;
            *pppcVar1 = *pppcVar1 + 1;
          }
        }
        uVar19 = 0;
      }
      else {
        if (*pcVar12 != '-') goto LAB_0010b80a;
        cVar3 = pcVar12[1];
        if (cVar3 == '-') {
          if (sVar8 == 2) goto LAB_0010b7ea;
          local_a60 = pcVar12 + 2;
          cVar6 = pcVar12[2];
        }
        else {
          local_a60 = pcVar12 + 1;
          cVar6 = cVar3;
        }
        iVar7 = isalnum((int)cVar6);
        pcVar10 = local_a60;
        if ((cVar3 == '-') && (iVar7 != 0)) {
          sVar9 = strlen(local_a60);
          local_a18._0_8_ = local_a18._0_8_ & 0xffffffffffffff00;
          pcVar20 = pcVar10 + sVar9;
          pcVar10 = std::
                    __find_if<char_const*,__gnu_cxx::__ops::_Iter_negate<argagg::cmd_line_arg_is_option_flag(char_const*)::_lambda(char_const&)_1_>>
                              (pcVar10,pcVar20,local_a18);
          pcVar12 = local_a98;
          if (pcVar10 != pcVar20) goto LAB_0010b7ea;
        }
        else if (iVar7 == 0) goto LAB_0010b7ea;
        if (pcVar12[1] != '-') {
          local_a60 = (char *)-sVar8;
          sVar9 = 2;
          local_a48 = sVar8;
          do {
            cVar3 = local_a98[sVar9 - 1];
            iVar7 = isalnum((int)cVar3);
            if (iVar7 == 0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a18);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_a18,"found non-alphanumeric character \'",0x22);
              local_a88._M_dataplus._M_p._0_1_ = local_a98[sVar9 - 1];
              poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_a18,(char *)&local_a88,1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\' in flag group \'",0x11)
              ;
              poVar14 = std::operator<<(poVar14,local_a98);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\'",1);
              this_00 = (domain_error *)__cxa_allocate_exception(0x10);
              std::__cxx11::stringbuf::str();
              std::domain_error::domain_error(this_00,(string *)&local_a88);
              __cxa_throw(this_00,&std::domain_error::typeinfo,std::domain_error::~domain_error);
            }
            __k = local_868.short_map._M_elems[(int)cVar3];
            if (__k == (definition *)0x0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a18);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_a18,"found unexpected flag \'",0x17);
              local_a88._M_dataplus._M_p._0_1_ = local_a98[sVar9 - 1];
              poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_a18,(char *)&local_a88,1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\' in flag group \'",0x11)
              ;
              poVar14 = std::operator<<(poVar14,local_a98);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\'",1);
              prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::__cxx11::stringbuf::str();
              std::runtime_error::runtime_error(prVar15,(string *)&local_a88);
              *(undefined ***)prVar15 = &PTR__runtime_error_00111cb8;
              __cxa_throw(prVar15,&unexpected_option_error::typeinfo,
                          std::runtime_error::~runtime_error);
            }
            pmVar13 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)local_a50,&__k->name);
            local_a18._0_8_ = (pointer)0x0;
            iVar5._M_current =
                 (pmVar13->all).
                 super__Vector_base<argagg::option_result,_std::allocator<argagg::option_result>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            if (iVar5._M_current ==
                (pmVar13->all).
                super__Vector_base<argagg::option_result,_std::allocator<argagg::option_result>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<argagg::option_result,_std::allocator<argagg::option_result>_>::
              _M_realloc_insert<argagg::option_result>
                        (&pmVar13->all,iVar5,(option_result *)local_a18);
            }
            else {
              (iVar5._M_current)->arg = (char *)0x0;
              ppoVar2 = &(pmVar13->all).
                         super__Vector_base<argagg::option_result,_std::allocator<argagg::option_result>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppoVar2 = *ppoVar2 + 1;
            }
            uVar19 = __k->num_args;
            if (uVar19 != 0) {
              if (sVar9 == local_a48) {
                local_a68 = local_a98;
                poVar16 = (pmVar13->all).
                          super__Vector_base<argagg::option_result,_std::allocator<argagg::option_result>_>
                          ._M_impl.super__Vector_impl_data._M_finish + -1;
              }
              else {
                (pmVar13->all).
                super__Vector_base<argagg::option_result,_std::allocator<argagg::option_result>_>.
                _M_impl.super__Vector_impl_data._M_finish[-1].arg = local_a98 + sVar9;
                uVar19 = 0;
                poVar16 = (pointer)0x0;
                local_a68 = (char *)0x0;
              }
              goto LAB_0010bac6;
            }
            pcVar12 = local_a60 + sVar9;
            sVar9 = sVar9 + 1;
            uVar19 = 0;
            poVar16 = (pointer)0x0;
            local_a68 = (char *)0x0;
            bVar17 = false;
          } while (pcVar12 != (char *)0x0);
          goto LAB_0010b82e;
        }
        pcVar10 = strchr(pcVar12,0x3d);
        sVar9 = (long)pcVar10 - (long)pcVar12;
        if (pcVar10 == (char *)0x0) {
          sVar9 = sVar8;
        }
        local_a88._M_dataplus._M_p = (pointer)&local_a88.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a88,pcVar12,pcVar12 + sVar9);
        cVar11 = std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&local_868.long_map._M_h,&local_a88);
        if (cVar11.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*>,_true>
            ._M_cur == (__node_type *)0x0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a18);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_a18,"found unexpected flag: ",0x17);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_a18,local_a88._M_dataplus._M_p,local_a88._M_string_length);
          prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar15,local_a38);
          *(undefined ***)prVar15 = &PTR__runtime_error_00111cb8;
          __cxa_throw(prVar15,&unexpected_option_error::typeinfo,std::runtime_error::~runtime_error)
          ;
        }
        cVar11 = std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&local_868.long_map._M_h,&local_a88);
        if (cVar11.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*>,_true>
            ._M_cur == (__node_type *)0x0) {
          __k_00 = (key_type *)0x0;
        }
        else {
          __k_00 = *(key_type **)
                    ((long)cVar11.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*>,_true>
                           ._M_cur + 0x28);
        }
        if ((pcVar10 != (char *)0x0) && (*(int *)((long)&__k_00[2].field_2 + 8) == 0)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a18);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_a18,"found argument for option not expecting an argument: ",
                     0x35);
          std::operator<<((ostream *)local_a18,local_a98);
          prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar15,local_a38);
          *(undefined ***)prVar15 = &PTR__runtime_error_00111ce0;
          __cxa_throw(prVar15,&unexpected_argument_error::typeinfo,
                      std::runtime_error::~runtime_error);
        }
        pmVar13 = std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)local_a50,__k_00);
        local_a18._0_8_ = (pointer)0x0;
        iVar5._M_current =
             (pmVar13->all).
             super__Vector_base<argagg::option_result,_std::allocator<argagg::option_result>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (pmVar13->all).
            super__Vector_base<argagg::option_result,_std::allocator<argagg::option_result>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<argagg::option_result,_std::allocator<argagg::option_result>_>::
          _M_realloc_insert<argagg::option_result>(&pmVar13->all,iVar5,(option_result *)local_a18);
        }
        else {
          (iVar5._M_current)->arg = (char *)0x0;
          ppoVar2 = &(pmVar13->all).
                     super__Vector_base<argagg::option_result,_std::allocator<argagg::option_result>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppoVar2 = *ppoVar2 + 1;
        }
        uVar19 = *(uint *)((long)&__k_00[2].field_2 + 8);
        if (uVar19 == 0) {
LAB_0010ba91:
          uVar19 = 0;
          poVar16 = (pointer)0x0;
          local_a68 = (char *)0x0;
        }
        else {
          poVar16 = (pmVar13->all).
                    super__Vector_base<argagg::option_result,_std::allocator<argagg::option_result>_>
                    ._M_impl.super__Vector_impl_data._M_finish + -1;
          local_a68 = local_a98;
          if (pcVar10 != (char *)0x0) {
            poVar16->arg = pcVar10 + 1;
            goto LAB_0010ba91;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a88._M_dataplus._M_p != &local_a88.field_2) {
          operator_delete(local_a88._M_dataplus._M_p);
        }
LAB_0010bac6:
        bVar17 = false;
      }
LAB_0010b82e:
      ppcVar18 = ppcVar18 + 1;
    } while (ppcVar18 != local_a58);
    if (uVar19 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a18);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a18,"last option \"",0xd);
      poVar14 = std::operator<<((ostream *)local_a18,local_a68);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar14,"\" expects an argument but the parser ran out of command line ",0x3d);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,"arguments to parse",0x12);
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar15,(string *)&local_a88);
      *(undefined ***)prVar15 = &PTR__runtime_error_00111d08;
      __cxa_throw(prVar15,&option_lacks_argument_error::typeinfo,std::runtime_error::~runtime_error)
      ;
    }
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_8a0);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_868.long_map._M_h);
  return local_a90;
}

Assistant:

inline
parser_results parser::parse(int argc, const char** argv) const
{
  // Inspect each definition to see if its valid. You may wonder "why don't
  // you do this validation on construction?" I had thought about it but
  // realized that since I've made the parser an aggregate type (granted it
  // just "aggregates" a single vector) I would need to track any changes to
  // the definitions vector and re-run the validity check in order to
  // maintain this expected "validity invariant" on the object. That would
  // then require hiding the definitions vector as a private entry and then
  // turning the parser into a thin interface (by re-exposing setters and
  // getters) to the vector methods just so that I can catch when the
  // definition has been modified. It seems much simpler to just enforce the
  // validity when you actually want to parse because it's at the moment of
  // parsing that you know the definitions are complete.
  parser_map map = validate_definitions(this->definitions);

  // Initialize the parser results that we'll be returning. Store the program
  // name (assumed to be the first command line argument) and initialize
  // everything else as empty.
  std::unordered_map<std::string, option_results> options {};
  std::vector<const char*> pos;
  parser_results results {argv[0], std::move(options), std::move(pos)};

  // Add an empty option result for each definition.
  for (const auto& defn : this->definitions) {
    option_results opt_results {{}};
    results.options.insert(
      std::make_pair(defn.name, opt_results));
  }

  // Don't start off ignoring flags. We only ignore flags after a -- shows up
  // in the command line arguments.
  bool ignore_flags = false;

  // Keep track of any options that are expecting arguments.
  const char* last_flag_expecting_args = nullptr;
  option_result* last_option_expecting_args = nullptr;
  unsigned int num_option_args_to_consume = 0;

  // Get pointers to pointers so we can treat the raw pointer array as an
  // iterator for standard library algorithms. This isn't used yet but can be
  // used to template this function to work on iterators over strings or
  // C-strings.
  const char** arg_i = argv + 1;
  const char** arg_end = argv + argc;

  while (arg_i != arg_end) {
    auto arg_i_cstr = *arg_i;
    auto arg_i_len = std::strlen(arg_i_cstr);

    // Some behavior to note: if the previous option is expecting an argument
    // then the next entry will be treated as a positional argument even if
    // it looks like a flag.
    bool treat_as_positional_argument = (
        ignore_flags
        || num_option_args_to_consume > 0
        || !cmd_line_arg_is_option_flag(arg_i_cstr)
      );
    if (treat_as_positional_argument) {

      // If last option is expecting some specific positive number of
      // arguments then give this argument to that option, *regardless of
      // whether or not the argument looks like a flag or is the special "--"
      // argument*.
      if (num_option_args_to_consume > 0) {
        last_option_expecting_args->arg = arg_i_cstr;
        --num_option_args_to_consume;
        ++arg_i;
        continue;
      }

      // Now we check if this is just "--" which is a special argument that
      // causes all following arguments to be treated as non-options and is
      // itselve discarded.
      if (std::strncmp(arg_i_cstr, "--", 2) == 0 && arg_i_len == 2) {
        ignore_flags = true;
        ++arg_i;
        continue;
      }

      // If there are no expectations for option arguments then simply use
      // this argument as a positional argument.
      results.pos.push_back(arg_i_cstr);
      ++arg_i;
      continue;
    }

    // Reset the "expecting argument" state.
    last_flag_expecting_args = nullptr;
    last_option_expecting_args = nullptr;
    num_option_args_to_consume = 0;

    // If we're at this point then we're definitely dealing with something
    // that is flag-like and has hyphen as the first character and has a
    // length of at least two characters. How we handle this potential flag
    // depends on whether or not it is a long-option so we check that first.
    bool is_long_flag = (arg_i_cstr[1] == '-');

    if (is_long_flag) {

      // Long flags have a complication: their arguments can be specified
      // using an '=' character right inside the argument. That means an
      // argument like "--output=foobar.txt" is actually an option with flag
      // "--output" and argument "foobar.txt". So we look for the first
      // instance of the '=' character and keep it in long_flag_arg. If
      // long_flag_arg is nullptr then we didn't find '='. We need the
      // flag_len to construct long_flag_str below.
      auto long_flag_arg = std::strchr(arg_i_cstr, '=');
      std::size_t flag_len = arg_i_len;
      if (long_flag_arg != nullptr) {
        flag_len = long_flag_arg - arg_i_cstr;
      }
      std::string long_flag_str(arg_i_cstr, flag_len);

      if (!map.known_long_flag(long_flag_str)) {
        std::ostringstream msg;
        msg << "found unexpected flag: " << long_flag_str;
        throw unexpected_option_error(msg.str());
      }

      const auto defn = map.get_definition_for_long_flag(long_flag_str);

      if (long_flag_arg != nullptr && defn->num_args == 0) {
        std::ostringstream msg;
        msg << "found argument for option not expecting an argument: "
            << arg_i_cstr;
        throw unexpected_argument_error(msg.str());
      }

      // We've got a legitimate, known long flag option so we add an option
      // result. This option result initially has an arg of nullptr, but that
      // might change in the following block.
      auto& opt_results = results.options[defn->name];
      option_result opt_result {nullptr};
      opt_results.all.push_back(std::move(opt_result));

      if (defn->requires_arguments()) {
        bool there_is_an_equal_delimited_arg = (long_flag_arg != nullptr);
        if (there_is_an_equal_delimited_arg) {
          // long_flag_arg would be "=foo" in the "--output=foo" case so we
          // increment by 1 to get rid of the equal sign.
          opt_results.all.back().arg = long_flag_arg + 1;
        } else {
          last_flag_expecting_args = arg_i_cstr;
          last_option_expecting_args = &(opt_results.all.back());
          num_option_args_to_consume = defn->num_args;
        }
      }

      ++arg_i;
      continue;
    }

    // If we've made it here then we're looking at either a short flag or a
    // group of short flags. Short flags can be grouped together so long as
    // they don't require any arguments unless the option that does is the
    // last in the group ("-o x -v" is okay, "-vo x" is okay, "-ov x" is
    // not). So starting after the dash we're going to process each character
    // as if it were a separate flag. Note "sf_idx" stands for "short flag
    // index".
    for (std::size_t sf_idx = 1; sf_idx < arg_i_len; ++sf_idx) {
      const auto short_flag = arg_i_cstr[sf_idx];

      if (!std::isalnum(short_flag)) {
        std::ostringstream msg;
        msg << "found non-alphanumeric character '" << arg_i_cstr[sf_idx]
            << "' in flag group '" << arg_i_cstr << "'";
        throw std::domain_error(msg.str());
      }

      if (!map.known_short_flag(short_flag)) {
        std::ostringstream msg;
        msg << "found unexpected flag '" << arg_i_cstr[sf_idx]
            << "' in flag group '" << arg_i_cstr << "'";
        throw unexpected_option_error(msg.str());
      }

      auto defn = map.get_definition_for_short_flag(short_flag);
      auto& opt_results = results.options[defn->name];

      // Create an option result with an empty argument (for now) and add it
      // to this option's results.
      option_result opt_result {nullptr};
      opt_results.all.push_back(std::move(opt_result));

      if (defn->requires_arguments()) {

        // If this short flag's option requires an argument and we're the
        // last flag in the short flag group then just put the parser into
        // "expecting argument for last option" state and move onto the next
        // command line argument.
        bool is_last_short_flag_in_group = (sf_idx == arg_i_len - 1);
        if (is_last_short_flag_in_group) {
          last_flag_expecting_args = arg_i_cstr;
          last_option_expecting_args = &(opt_results.all.back());
          num_option_args_to_consume = defn->num_args;
          break;
        }

        // If this short flag's option requires an argument and we're NOT the
        // last flag in the short flag group then we automatically consume
        // the rest of the short flag group as the argument for this flag.
        // This is how we get the POSIX behavior of being able to specify a
        // flag's arguments without a white space delimiter (e.g.
        // "-I/usr/local/include").
        opt_results.all.back().arg = arg_i_cstr + sf_idx + 1;
        break;
      }
    }

    ++arg_i;
    continue;
  }

  // If we're done with all of the arguments but are still expecting
  // arguments for a previous option then we haven't satisfied that option.
  // This is an error.
  if (num_option_args_to_consume > 0) {
    std::ostringstream msg;
    msg << "last option \"" << last_flag_expecting_args
        << "\" expects an argument but the parser ran out of command line "
        << "arguments to parse";
    throw option_lacks_argument_error(msg.str());
  }

  return results;
}